

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

bool embree::avx::SphereMiMBIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *sphere)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  Geometry *pGVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  byte bVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  Scene *pSVar24;
  byte bVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  undefined4 uVar29;
  ulong uVar30;
  ulong uVar31;
  float fVar32;
  float fVar33;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar34 [16];
  float fVar38;
  float fVar39;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  float fVar48;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar60;
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  float fVar81;
  float fVar82;
  undefined1 auVar80 [32];
  float fVar83;
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<8> hit;
  int local_2c4;
  Scene *local_2c0;
  RayQueryContext *local_2b8;
  Primitive *local_2b0;
  float local_2a4;
  RTCFilterFunctionNArguments local_2a0;
  undefined4 local_270;
  uint local_26c;
  uint local_268;
  undefined8 local_264;
  uint local_25c;
  uint local_258;
  uint local_254;
  uint local_250;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar75 [64];
  
  pSVar24 = context->scene;
  uVar27 = sphere->sharedGeomID;
  pGVar2 = (pSVar24->geometries).items[uVar27].ptr;
  fVar81 = (pGVar2->time_range).lower;
  fVar81 = pGVar2->fnumTimeSegments *
           (((ray->dir).field_0.m128[3] - fVar81) / ((pGVar2->time_range).upper - fVar81));
  auVar34 = vroundss_avx(ZEXT416((uint)fVar81),ZEXT416((uint)fVar81),9);
  auVar34 = vminss_avx(auVar34,ZEXT416((uint)(pGVar2->fnumTimeSegments + -1.0)));
  auVar34 = vmaxss_avx(ZEXT816(0) << 0x20,auVar34);
  uVar19 = (ulong)(sphere->primIDs).field_0.i[0];
  lVar3 = *(long *)&pGVar2[2].numPrimitives;
  lVar21 = (long)(int)auVar34._0_4_ * 0x38;
  lVar4 = *(long *)(lVar3 + lVar21);
  lVar5 = *(long *)(lVar3 + 0x10 + lVar21);
  uVar22 = (ulong)(sphere->primIDs).field_0.i[1];
  uVar23 = (ulong)(sphere->primIDs).field_0.i[2];
  uVar31 = (ulong)(sphere->primIDs).field_0.i[3];
  uVar20 = (ulong)(sphere->primIDs).field_0.i[4];
  auVar49._16_16_ = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar20);
  auVar49._0_16_ = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar19);
  uVar30 = (ulong)(sphere->primIDs).field_0.i[5];
  auVar61._16_16_ = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar30);
  auVar61._0_16_ = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar22);
  uVar26 = (ulong)(sphere->primIDs).field_0.i[6];
  auVar66._16_16_ = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar26);
  auVar66._0_16_ = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar23);
  uVar28 = (ulong)(sphere->primIDs).field_0.i[7];
  auVar68._16_16_ = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar28);
  auVar68._0_16_ = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar31);
  lVar4 = *(long *)(lVar3 + 0x38 + lVar21);
  lVar3 = *(long *)(lVar3 + 0x48 + lVar21);
  auVar72._16_16_ = *(undefined1 (*) [16])(lVar4 + uVar20 * lVar3);
  auVar72._0_16_ = *(undefined1 (*) [16])(lVar4 + uVar19 * lVar3);
  auVar76._16_16_ = *(undefined1 (*) [16])(lVar4 + uVar30 * lVar3);
  auVar76._0_16_ = *(undefined1 (*) [16])(lVar4 + uVar22 * lVar3);
  auVar78._16_16_ = *(undefined1 (*) [16])(lVar4 + uVar26 * lVar3);
  auVar78._0_16_ = *(undefined1 (*) [16])(lVar4 + uVar23 * lVar3);
  auVar80._16_16_ = *(undefined1 (*) [16])(lVar4 + lVar3 * uVar28);
  auVar80._0_16_ = *(undefined1 (*) [16])(lVar4 + uVar31 * lVar3);
  fVar81 = fVar81 - auVar34._0_4_;
  auVar51 = vunpcklps_avx(auVar49,auVar66);
  auVar49 = vunpckhps_avx(auVar49,auVar66);
  auVar8 = vunpcklps_avx(auVar61,auVar68);
  auVar50 = vunpckhps_avx(auVar61,auVar68);
  auVar9 = vunpcklps_avx(auVar51,auVar8);
  auVar51 = vunpckhps_avx(auVar51,auVar8);
  auVar10 = vunpcklps_avx(auVar49,auVar50);
  auVar49 = vunpckhps_avx(auVar49,auVar50);
  auVar11 = vunpcklps_avx(auVar72,auVar78);
  auVar50 = vunpckhps_avx(auVar72,auVar78);
  auVar61 = vunpcklps_avx(auVar76,auVar80);
  auVar8 = vunpckhps_avx(auVar76,auVar80);
  auVar12 = vunpcklps_avx(auVar11,auVar61);
  auVar11 = vunpckhps_avx(auVar11,auVar61);
  auVar63 = vunpcklps_avx(auVar50,auVar8);
  auVar61 = vunpckhps_avx(auVar50,auVar8);
  auVar34 = vshufps_avx(ZEXT416((uint)fVar81),ZEXT416((uint)fVar81),0);
  auVar7 = vshufps_avx(ZEXT416((uint)(1.0 - fVar81)),ZEXT416((uint)(1.0 - fVar81)),0);
  fVar81 = auVar34._0_4_;
  fVar33 = auVar34._4_4_;
  fVar83 = auVar34._8_4_;
  fVar82 = auVar34._12_4_;
  fVar32 = auVar7._0_4_;
  fVar35 = auVar7._4_4_;
  fVar36 = auVar7._8_4_;
  fVar37 = auVar7._12_4_;
  auVar69._0_4_ = auVar12._0_4_ * fVar81 + fVar32 * auVar9._0_4_;
  auVar69._4_4_ = auVar12._4_4_ * fVar33 + fVar35 * auVar9._4_4_;
  auVar69._8_4_ = auVar12._8_4_ * fVar83 + fVar36 * auVar9._8_4_;
  auVar69._12_4_ = auVar12._12_4_ * fVar82 + fVar37 * auVar9._12_4_;
  auVar69._16_4_ = auVar12._16_4_ * fVar81 + fVar32 * auVar9._16_4_;
  auVar69._20_4_ = auVar12._20_4_ * fVar33 + fVar35 * auVar9._20_4_;
  auVar69._24_4_ = auVar12._24_4_ * fVar83 + fVar36 * auVar9._24_4_;
  auVar69._28_4_ = auVar12._28_4_ + auVar9._28_4_;
  auVar62._0_4_ = fVar32 * auVar51._0_4_ + fVar81 * auVar11._0_4_;
  auVar62._4_4_ = fVar35 * auVar51._4_4_ + fVar33 * auVar11._4_4_;
  auVar62._8_4_ = fVar36 * auVar51._8_4_ + fVar83 * auVar11._8_4_;
  auVar62._12_4_ = fVar37 * auVar51._12_4_ + fVar82 * auVar11._12_4_;
  auVar62._16_4_ = fVar32 * auVar51._16_4_ + fVar81 * auVar11._16_4_;
  auVar62._20_4_ = fVar35 * auVar51._20_4_ + fVar33 * auVar11._20_4_;
  auVar62._24_4_ = fVar36 * auVar51._24_4_ + fVar83 * auVar11._24_4_;
  auVar62._28_4_ = auVar51._28_4_ + auVar11._28_4_;
  auVar67._0_4_ = auVar63._0_4_ * fVar81 + fVar32 * auVar10._0_4_;
  auVar67._4_4_ = auVar63._4_4_ * fVar33 + fVar35 * auVar10._4_4_;
  auVar67._8_4_ = auVar63._8_4_ * fVar83 + fVar36 * auVar10._8_4_;
  auVar67._12_4_ = auVar63._12_4_ * fVar82 + fVar37 * auVar10._12_4_;
  auVar67._16_4_ = auVar63._16_4_ * fVar81 + fVar32 * auVar10._16_4_;
  auVar67._20_4_ = auVar63._20_4_ * fVar33 + fVar35 * auVar10._20_4_;
  auVar67._24_4_ = auVar63._24_4_ * fVar83 + fVar36 * auVar10._24_4_;
  auVar67._28_4_ = auVar63._28_4_ + auVar51._28_4_;
  local_210 = vshufps_avx(ZEXT416(uVar27),ZEXT416(uVar27),0);
  local_220 = local_210;
  aVar1 = (ray->dir).field_0;
  auVar34 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
  fVar39 = fVar32 * auVar49._0_4_ + fVar81 * auVar61._0_4_;
  fVar42 = fVar35 * auVar49._4_4_ + fVar33 * auVar61._4_4_;
  fVar43 = fVar36 * auVar49._8_4_ + fVar83 * auVar61._8_4_;
  fVar44 = fVar37 * auVar49._12_4_ + fVar82 * auVar61._12_4_;
  fVar45 = fVar32 * auVar49._16_4_ + fVar81 * auVar61._16_4_;
  fVar46 = fVar35 * auVar49._20_4_ + fVar33 * auVar61._20_4_;
  fVar47 = fVar36 * auVar49._24_4_ + fVar83 * auVar61._24_4_;
  auVar7 = vrcpss_avx(auVar34,auVar34);
  auVar34 = ZEXT416((uint)(auVar7._0_4_ * (2.0 - auVar34._0_4_ * auVar7._0_4_)));
  auVar34 = vshufps_avx(auVar34,auVar34,0);
  uVar29 = *(undefined4 *)&(ray->org).field_0;
  auVar50._4_4_ = uVar29;
  auVar50._0_4_ = uVar29;
  auVar50._8_4_ = uVar29;
  auVar50._12_4_ = uVar29;
  auVar50._16_4_ = uVar29;
  auVar50._20_4_ = uVar29;
  auVar50._24_4_ = uVar29;
  auVar50._28_4_ = uVar29;
  fVar81 = *(float *)((long)&(ray->org).field_0 + 4);
  auVar73._4_4_ = fVar81;
  auVar73._0_4_ = fVar81;
  auVar73._8_4_ = fVar81;
  auVar73._12_4_ = fVar81;
  auVar73._16_4_ = fVar81;
  auVar73._20_4_ = fVar81;
  auVar73._24_4_ = fVar81;
  auVar73._28_4_ = fVar81;
  auVar49 = vsubps_avx(auVar69,auVar50);
  auVar50 = vsubps_avx(auVar62,auVar73);
  fVar33 = *(float *)((long)&(ray->org).field_0 + 8);
  auVar51._4_4_ = fVar33;
  auVar51._0_4_ = fVar33;
  auVar51._8_4_ = fVar33;
  auVar51._12_4_ = fVar33;
  auVar51._16_4_ = fVar33;
  auVar51._20_4_ = fVar33;
  auVar51._24_4_ = fVar33;
  auVar51._28_4_ = fVar33;
  local_240 = (ray->dir).field_0.m128[0];
  fVar83 = (ray->dir).field_0.m128[1];
  auVar51 = vsubps_avx(auVar67,auVar51);
  fVar32 = (ray->dir).field_0.m128[2];
  fVar60 = fVar81 + fVar81 + fVar33;
  fVar33 = auVar34._0_4_;
  fVar48 = fVar33 * (local_240 * auVar49._0_4_ + fVar83 * auVar50._0_4_ + fVar32 * auVar51._0_4_);
  fVar35 = auVar34._4_4_;
  fVar54 = fVar35 * (local_240 * auVar49._4_4_ + fVar83 * auVar50._4_4_ + fVar32 * auVar51._4_4_);
  auVar10._4_4_ = fVar54;
  auVar10._0_4_ = fVar48;
  fVar36 = auVar34._8_4_;
  fVar55 = fVar36 * (local_240 * auVar49._8_4_ + fVar83 * auVar50._8_4_ + fVar32 * auVar51._8_4_);
  auVar10._8_4_ = fVar55;
  fVar38 = auVar34._12_4_;
  fVar56 = fVar38 * (local_240 * auVar49._12_4_ + fVar83 * auVar50._12_4_ + fVar32 * auVar51._12_4_)
  ;
  auVar10._12_4_ = fVar56;
  fVar57 = fVar33 * (local_240 * auVar49._16_4_ + fVar83 * auVar50._16_4_ + fVar32 * auVar51._16_4_)
  ;
  auVar10._16_4_ = fVar57;
  fVar58 = fVar35 * (local_240 * auVar49._20_4_ + fVar83 * auVar50._20_4_ + fVar32 * auVar51._20_4_)
  ;
  auVar10._20_4_ = fVar58;
  fVar59 = fVar36 * (local_240 * auVar49._24_4_ + fVar83 * auVar50._24_4_ + fVar32 * auVar51._24_4_)
  ;
  auVar10._24_4_ = fVar59;
  auVar10._28_4_ = fVar60;
  auVar8._4_4_ = local_240 * fVar54;
  auVar8._0_4_ = local_240 * fVar48;
  auVar8._8_4_ = local_240 * fVar55;
  auVar8._12_4_ = local_240 * fVar56;
  auVar8._16_4_ = local_240 * fVar57;
  auVar8._20_4_ = local_240 * fVar58;
  auVar8._24_4_ = local_240 * fVar59;
  auVar8._28_4_ = fVar81;
  auVar11._4_4_ = fVar83 * fVar54;
  auVar11._0_4_ = fVar83 * fVar48;
  auVar11._8_4_ = fVar83 * fVar55;
  auVar11._12_4_ = fVar83 * fVar56;
  auVar11._16_4_ = fVar83 * fVar57;
  auVar11._20_4_ = fVar83 * fVar58;
  auVar11._24_4_ = fVar83 * fVar59;
  auVar11._28_4_ = fVar82;
  auVar9._4_4_ = fVar32 * fVar54;
  auVar9._0_4_ = fVar32 * fVar48;
  auVar9._8_4_ = fVar32 * fVar55;
  auVar9._12_4_ = fVar32 * fVar56;
  auVar9._16_4_ = fVar32 * fVar57;
  auVar9._20_4_ = fVar32 * fVar58;
  auVar9._24_4_ = fVar32 * fVar59;
  auVar9._28_4_ = auVar63._28_4_;
  auVar8 = vsubps_avx(auVar49,auVar8);
  auVar85 = ZEXT3264(auVar8);
  auVar11 = vsubps_avx(auVar50,auVar11);
  auVar77 = ZEXT3264(auVar11);
  auVar9 = vsubps_avx(auVar51,auVar9);
  auVar79 = ZEXT3264(auVar9);
  auVar63._0_4_ =
       auVar8._0_4_ * auVar8._0_4_ + auVar11._0_4_ * auVar11._0_4_ + auVar9._0_4_ * auVar9._0_4_;
  auVar63._4_4_ =
       auVar8._4_4_ * auVar8._4_4_ + auVar11._4_4_ * auVar11._4_4_ + auVar9._4_4_ * auVar9._4_4_;
  auVar63._8_4_ =
       auVar8._8_4_ * auVar8._8_4_ + auVar11._8_4_ * auVar11._8_4_ + auVar9._8_4_ * auVar9._8_4_;
  auVar63._12_4_ =
       auVar8._12_4_ * auVar8._12_4_ +
       auVar11._12_4_ * auVar11._12_4_ + auVar9._12_4_ * auVar9._12_4_;
  auVar63._16_4_ =
       auVar8._16_4_ * auVar8._16_4_ +
       auVar11._16_4_ * auVar11._16_4_ + auVar9._16_4_ * auVar9._16_4_;
  auVar63._20_4_ =
       auVar8._20_4_ * auVar8._20_4_ +
       auVar11._20_4_ * auVar11._20_4_ + auVar9._20_4_ * auVar9._20_4_;
  auVar63._24_4_ =
       auVar8._24_4_ * auVar8._24_4_ +
       auVar11._24_4_ * auVar11._24_4_ + auVar9._24_4_ * auVar9._24_4_;
  auVar63._28_4_ = auVar51._28_4_ + auVar51._28_4_ + auVar50._28_4_;
  auVar12._4_4_ = fVar42 * fVar42;
  auVar12._0_4_ = fVar39 * fVar39;
  auVar12._8_4_ = fVar43 * fVar43;
  auVar12._12_4_ = fVar44 * fVar44;
  auVar12._16_4_ = fVar45 * fVar45;
  auVar12._20_4_ = fVar46 * fVar46;
  auVar12._24_4_ = fVar47 * fVar47;
  auVar12._28_4_ = fVar37 + auVar61._28_4_;
  auVar49 = vcmpps_avx(auVar63,auVar12,2);
  auVar34 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar70._16_16_ = auVar34;
  auVar70._0_16_ = auVar34;
  auVar50 = vcvtdq2ps_avx(auVar70);
  auVar50 = vcmpps_avx(_DAT_02020f40,auVar50,1);
  auVar51 = auVar50 & auVar49;
  if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar51 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar51 >> 0x7f,0) != '\0') ||
        (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar51 >> 0xbf,0) != '\0') ||
      (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar51[0x1f] < '\0') {
    auVar49 = vandps_avx(auVar49,auVar50);
    auVar50 = vsubps_avx(auVar12,auVar63);
    auVar13._4_4_ = fVar35 * auVar50._4_4_;
    auVar13._0_4_ = fVar33 * auVar50._0_4_;
    auVar13._8_4_ = fVar36 * auVar50._8_4_;
    auVar13._12_4_ = fVar38 * auVar50._12_4_;
    auVar13._16_4_ = fVar33 * auVar50._16_4_;
    auVar13._20_4_ = fVar35 * auVar50._20_4_;
    auVar13._24_4_ = fVar36 * auVar50._24_4_;
    auVar13._28_4_ = fVar38;
    auVar12 = vsqrtps_avx(auVar13);
    auVar84 = ZEXT3264(auVar12);
    auVar10 = vsubps_avx(auVar10,auVar12);
    auVar74._0_4_ = auVar12._0_4_ + fVar48;
    auVar74._4_4_ = auVar12._4_4_ + fVar54;
    auVar74._8_4_ = auVar12._8_4_ + fVar55;
    auVar74._12_4_ = auVar12._12_4_ + fVar56;
    auVar74._16_4_ = auVar12._16_4_ + fVar57;
    auVar74._20_4_ = auVar12._20_4_ + fVar58;
    auVar74._24_4_ = auVar12._24_4_ + fVar59;
    auVar74._28_4_ = auVar12._28_4_ + fVar60;
    auVar75 = ZEXT3264(auVar74);
    auVar34 = SUB3216(*(undefined1 (*) [32])((long)&(ray->org).field_0 + 0xc),0);
    auVar34 = vshufps_avx(auVar34,auVar34,0);
    auVar40._16_16_ = auVar34;
    auVar40._0_16_ = auVar34;
    auVar50 = vcmpps_avx(auVar40,auVar10,2);
    fVar81 = ray->tfar;
    auVar64._4_4_ = fVar81;
    auVar64._0_4_ = fVar81;
    auVar64._8_4_ = fVar81;
    auVar64._12_4_ = fVar81;
    auVar64._16_4_ = fVar81;
    auVar64._20_4_ = fVar81;
    auVar64._24_4_ = fVar81;
    auVar64._28_4_ = fVar81;
    auVar51 = vcmpps_avx(auVar10,auVar64,2);
    auVar50 = vandps_avx(auVar51,auVar50);
    auVar50 = vandps_avx(auVar50,auVar49);
    auVar71 = ZEXT3264(auVar50);
    auVar51 = vcmpps_avx(auVar40,auVar74,2);
    auVar61 = vcmpps_avx(auVar74,auVar64,2);
    auVar51 = vandps_avx(auVar61,auVar51);
    auVar51 = vandps_avx(auVar51,auVar49);
    auVar86 = ZEXT3264(auVar51);
    auVar51 = vorps_avx(auVar51,auVar50);
    if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar51 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar51 >> 0x7f,0) != '\0') ||
          (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar51 >> 0xbf,0) != '\0') ||
        (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar51[0x1f] < '\0')
    {
      auVar52._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
      auVar52._8_4_ = -auVar12._8_4_;
      auVar52._12_4_ = -auVar12._12_4_;
      auVar52._16_4_ = -auVar12._16_4_;
      auVar52._20_4_ = -auVar12._20_4_;
      auVar52._24_4_ = -auVar12._24_4_;
      auVar52._28_4_ = -auVar12._28_4_;
      local_200 = vblendvps_avx(auVar74,auVar10,auVar50);
      auVar50 = vblendvps_avx(auVar12,auVar52,auVar50);
      fVar33 = auVar50._0_4_;
      fVar82 = auVar50._4_4_;
      auVar14._4_4_ = local_240 * fVar82;
      auVar14._0_4_ = local_240 * fVar33;
      fVar35 = auVar50._8_4_;
      auVar14._8_4_ = local_240 * fVar35;
      fVar36 = auVar50._12_4_;
      auVar14._12_4_ = local_240 * fVar36;
      fVar37 = auVar50._16_4_;
      auVar14._16_4_ = local_240 * fVar37;
      fVar38 = auVar50._20_4_;
      auVar14._20_4_ = local_240 * fVar38;
      fVar39 = auVar50._24_4_;
      auVar14._24_4_ = local_240 * fVar39;
      auVar14._28_4_ = fVar81;
      auVar15._4_4_ = fVar83 * fVar82;
      auVar15._0_4_ = fVar83 * fVar33;
      auVar15._8_4_ = fVar83 * fVar35;
      auVar15._12_4_ = fVar83 * fVar36;
      auVar15._16_4_ = fVar83 * fVar37;
      auVar15._20_4_ = fVar83 * fVar38;
      auVar15._24_4_ = fVar83 * fVar39;
      auVar15._28_4_ = auVar49._28_4_;
      auVar16._4_4_ = fVar32 * fVar82;
      auVar16._0_4_ = fVar32 * fVar33;
      auVar16._8_4_ = fVar32 * fVar35;
      auVar16._12_4_ = fVar32 * fVar36;
      auVar16._16_4_ = fVar32 * fVar37;
      auVar16._20_4_ = fVar32 * fVar38;
      auVar16._24_4_ = fVar32 * fVar39;
      auVar16._28_4_ = auVar50._28_4_;
      local_1e0 = vsubps_avx(auVar14,auVar8);
      auVar65 = ZEXT3264(local_1e0);
      local_1c0 = vsubps_avx(auVar15,auVar11);
      local_1a0 = vsubps_avx(auVar16,auVar9);
      auVar53 = ZEXT3264(local_1a0);
      uVar27 = vmovmskps_avx(auVar51);
      uVar31 = (ulong)uVar27;
      fVar81 = local_240;
      fVar33 = local_240;
      fVar82 = local_240;
      fVar35 = local_240;
      fVar36 = local_240;
      fVar37 = local_240;
      fVar38 = local_240;
      fVar39 = fVar83;
      fVar42 = fVar83;
      fVar43 = fVar83;
      fVar44 = fVar83;
      fVar45 = fVar83;
      fVar46 = fVar83;
      fVar47 = fVar83;
      fVar48 = fVar32;
      fVar54 = fVar32;
      fVar55 = fVar32;
      fVar56 = fVar32;
      fVar57 = fVar32;
      fVar58 = fVar32;
      fVar59 = fVar32;
      local_2c0 = pSVar24;
      local_2b8 = context;
      local_2b0 = sphere;
      do {
        local_2a0.hit = (RTCHitN *)&local_270;
        uVar19 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        local_258 = *(uint *)(local_220 + uVar19 * 4);
        pGVar2 = (pSVar24->geometries).items[local_258].ptr;
        local_2a0.ray = (RTCRayN *)ray;
        if ((pGVar2->mask & ray->mask) == 0) {
LAB_011b9b2a:
          uVar31 = uVar31 ^ 1L << (uVar19 & 0x3f);
          bVar25 = 1;
        }
        else {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_25c = (local_2b0->primIDs).field_0.i[uVar19];
            local_270 = *(undefined4 *)(local_1e0 + uVar19 * 4);
            local_26c = *(uint *)(local_1c0 + uVar19 * 4);
            auVar53 = ZEXT464(local_26c);
            local_268 = *(uint *)(local_1a0 + uVar19 * 4);
            auVar65 = ZEXT464(local_268);
            local_264 = 0;
            local_254 = context->user->instID[0];
            local_250 = context->user->instPrimID[0];
            local_2a4 = ray->tfar;
            ray->tfar = *(float *)(local_200 + uVar19 * 4);
            local_2c4 = -1;
            local_2a0.geometryUserPtr = pGVar2->userPtr;
            local_2a0.context = context->user;
            local_2a0.N = 1;
            local_80 = fVar83;
            fStack_7c = fVar39;
            fStack_78 = fVar42;
            fStack_74 = fVar43;
            fStack_70 = fVar44;
            fStack_6c = fVar45;
            fStack_68 = fVar46;
            fStack_64 = fVar47;
            local_a0 = fVar32;
            fStack_9c = fVar48;
            fStack_98 = fVar54;
            fStack_94 = fVar55;
            fStack_90 = fVar56;
            fStack_8c = fVar57;
            fStack_88 = fVar58;
            fStack_84 = fVar59;
            local_c0 = auVar85._0_32_;
            local_e0 = auVar77._0_32_;
            local_100 = auVar79._0_32_;
            local_120 = auVar75._0_32_;
            local_140 = auVar84._0_32_;
            local_160 = auVar71._0_32_;
            local_180 = auVar86._0_32_;
            local_2a0.valid = &local_2c4;
            fStack_23c = fVar81;
            fStack_238 = fVar33;
            fStack_234 = fVar82;
            fStack_230 = fVar35;
            fStack_22c = fVar36;
            fStack_228 = fVar37;
            fStack_224 = fVar38;
            if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar53 = ZEXT464(local_26c);
              auVar65 = ZEXT464(local_268);
              (*pGVar2->occlusionFilterN)(&local_2a0);
              auVar86 = ZEXT3264(local_180);
              auVar71 = ZEXT3264(local_160);
              auVar84 = ZEXT3264(local_140);
              auVar75 = ZEXT3264(local_120);
              auVar79 = ZEXT3264(local_100);
              auVar77 = ZEXT3264(local_e0);
              auVar85 = ZEXT3264(local_c0);
              context = local_2b8;
              pSVar24 = local_2c0;
              if (*local_2a0.valid != 0) goto LAB_011b9ce3;
LAB_011b9d87:
              ray->tfar = local_2a4;
              fVar81 = fStack_23c;
              fVar33 = fStack_238;
              fVar82 = fStack_234;
              fVar35 = fStack_230;
              fVar36 = fStack_22c;
              fVar37 = fStack_228;
              fVar38 = fStack_224;
              fVar83 = local_80;
              fVar39 = fStack_7c;
              fVar42 = fStack_78;
              fVar43 = fStack_74;
              fVar44 = fStack_70;
              fVar45 = fStack_6c;
              fVar46 = fStack_68;
              fVar47 = fStack_64;
              fVar32 = local_a0;
              fVar48 = fStack_9c;
              fVar54 = fStack_98;
              fVar55 = fStack_94;
              fVar56 = fStack_90;
              fVar57 = fStack_8c;
              fVar58 = fStack_88;
              fVar59 = fStack_84;
              goto LAB_011b9b2a;
            }
LAB_011b9ce3:
            p_Var6 = context->args->filter;
            fVar81 = fStack_23c;
            fVar33 = fStack_238;
            fVar82 = fStack_234;
            fVar35 = fStack_230;
            fVar36 = fStack_22c;
            fVar37 = fStack_228;
            fVar38 = fStack_224;
            fVar83 = local_80;
            fVar39 = fStack_7c;
            fVar42 = fStack_78;
            fVar43 = fStack_74;
            fVar44 = fStack_70;
            fVar45 = fStack_6c;
            fVar46 = fStack_68;
            fVar47 = fStack_64;
            fVar32 = local_a0;
            fVar48 = fStack_9c;
            fVar54 = fStack_98;
            fVar55 = fStack_94;
            fVar56 = fStack_90;
            fVar57 = fStack_8c;
            fVar58 = fStack_88;
            fVar59 = fStack_84;
            if (p_Var6 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar2->field_8).field_0x2 & 0x40) != 0)) {
                auVar53 = ZEXT1664(auVar53._0_16_);
                auVar65 = ZEXT1664(auVar65._0_16_);
                (*p_Var6)(&local_2a0);
                auVar86 = ZEXT3264(local_180);
                auVar71 = ZEXT3264(local_160);
                auVar84 = ZEXT3264(local_140);
                auVar75 = ZEXT3264(local_120);
                auVar79 = ZEXT3264(local_100);
                auVar77 = ZEXT3264(local_e0);
                auVar85 = ZEXT3264(local_c0);
                context = local_2b8;
                pSVar24 = local_2c0;
              }
              fVar81 = fStack_23c;
              fVar33 = fStack_238;
              fVar82 = fStack_234;
              fVar35 = fStack_230;
              fVar36 = fStack_22c;
              fVar37 = fStack_228;
              fVar38 = fStack_224;
              fVar83 = local_80;
              fVar39 = fStack_7c;
              fVar42 = fStack_78;
              fVar43 = fStack_74;
              fVar44 = fStack_70;
              fVar45 = fStack_6c;
              fVar46 = fStack_68;
              fVar47 = fStack_64;
              fVar32 = local_a0;
              fVar48 = fStack_9c;
              fVar54 = fStack_98;
              fVar55 = fStack_94;
              fVar56 = fStack_90;
              fVar57 = fStack_8c;
              fVar58 = fStack_88;
              fVar59 = fStack_84;
              if (*local_2a0.valid == 0) goto LAB_011b9d87;
            }
          }
          bVar25 = 0;
        }
      } while ((bVar25 != 0) && (uVar31 != 0));
      auVar49 = vandps_avx(auVar86._0_32_,auVar71._0_32_);
      fVar38 = ray->tfar;
      auVar41._4_4_ = fVar38;
      auVar41._0_4_ = fVar38;
      auVar41._8_4_ = fVar38;
      auVar41._12_4_ = fVar38;
      auVar41._16_4_ = fVar38;
      auVar41._20_4_ = fVar38;
      auVar41._24_4_ = fVar38;
      auVar41._28_4_ = fVar38;
      auVar50 = vcmpps_avx(auVar75._0_32_,auVar41,2);
      auVar51 = auVar49 & auVar50;
      if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar51 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar51 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar51 >> 0x7f,0) == '\0') &&
            (auVar51 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar51 >> 0xbf,0) == '\0') &&
          (auVar51 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar51[0x1f])
      {
        return (bool)(bVar25 ^ 1);
      }
      auVar49 = vandps_avx(auVar50,auVar49);
      fVar38 = auVar84._0_4_;
      fVar47 = auVar84._4_4_;
      auVar17._4_4_ = fVar81 * fVar47;
      auVar17._0_4_ = local_240 * fVar38;
      fVar81 = auVar84._8_4_;
      auVar17._8_4_ = fVar33 * fVar81;
      fVar33 = auVar84._12_4_;
      auVar17._12_4_ = fVar82 * fVar33;
      fVar82 = auVar84._16_4_;
      auVar17._16_4_ = fVar35 * fVar82;
      fVar35 = auVar84._20_4_;
      auVar17._20_4_ = fVar36 * fVar35;
      fVar36 = auVar84._24_4_;
      auVar17._24_4_ = fVar37 * fVar36;
      auVar17._28_4_ = auVar50._28_4_;
      auVar71._0_4_ = fVar83 * fVar38;
      auVar71._4_4_ = fVar39 * fVar47;
      auVar71._8_4_ = fVar42 * fVar81;
      auVar71._12_4_ = fVar43 * fVar33;
      auVar71._16_4_ = fVar44 * fVar82;
      auVar71._20_4_ = fVar45 * fVar35;
      auVar71._28_36_ = auVar53._28_36_;
      auVar71._24_4_ = fVar46 * fVar36;
      auVar84._0_4_ = fVar32 * fVar38;
      auVar84._4_4_ = fVar48 * fVar47;
      auVar84._8_4_ = fVar54 * fVar81;
      auVar84._12_4_ = fVar55 * fVar33;
      auVar84._16_4_ = fVar56 * fVar82;
      auVar84._20_4_ = fVar57 * fVar35;
      auVar84._28_36_ = auVar65._28_36_;
      auVar84._24_4_ = fVar58 * fVar36;
      local_1e0 = vsubps_avx(auVar17,auVar85._0_32_);
      local_1c0 = vsubps_avx(auVar71._0_32_,auVar77._0_32_);
      local_1a0 = vsubps_avx(auVar84._0_32_,auVar79._0_32_);
      local_200 = auVar75._0_32_;
      local_2c0 = context->scene;
      uVar29 = vmovmskps_avx(auVar49);
      uVar31 = CONCAT44((int)(uVar19 >> 0x20),uVar29);
      do {
        local_2a0.hit = (RTCHitN *)&local_270;
        local_2a0.valid = &local_2c4;
        uVar19 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        local_258 = *(uint *)(local_220 + uVar19 * 4);
        pGVar2 = (local_2c0->geometries).items[local_258].ptr;
        if ((pGVar2->mask & ray->mask) == 0) {
LAB_011b9e45:
          uVar31 = uVar31 ^ 1L << (uVar19 & 0x3f);
          bVar18 = 1;
        }
        else {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_25c = (local_2b0->primIDs).field_0.i[uVar19];
            local_270 = *(undefined4 *)(local_1e0 + uVar19 * 4);
            local_26c = *(uint *)(local_1c0 + uVar19 * 4);
            local_268 = *(uint *)(local_1a0 + uVar19 * 4);
            local_264 = 0;
            local_254 = context->user->instID[0];
            local_250 = context->user->instPrimID[0];
            local_240 = ray->tfar;
            ray->tfar = *(float *)(local_200 + uVar19 * 4);
            local_2c4 = -1;
            local_2a0.geometryUserPtr = pGVar2->userPtr;
            local_2a0.context = context->user;
            local_2a0.N = 1;
            local_2a0.ray = (RTCRayN *)ray;
            if ((pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) &&
               ((*pGVar2->occlusionFilterN)(&local_2a0), context = local_2b8, *local_2a0.valid == 0)
               ) {
LAB_011b9f8c:
              ray->tfar = local_240;
              goto LAB_011b9e45;
            }
            p_Var6 = context->args->filter;
            if (p_Var6 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar2->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var6)(&local_2a0);
                context = local_2b8;
              }
              if (*local_2a0.valid == 0) goto LAB_011b9f8c;
            }
          }
          bVar18 = 0;
        }
        if ((bVar18 == 0) || (uVar31 == 0)) {
          return (bool)(bVar25 ^ 1 | bVar18 ^ 1);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre,
                                         Ray& ray,
                                         RayQueryContext* context,
                                         const Primitive& sphere)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom, ray.time());
        const vbool<M> valid = sphere.valid();
        return SphereIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Occluded1EpilogM<M, filter>(ray, context, sphere.geomID(), sphere.primID()));
      }